

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::render_thrift_error
          (t_rs_generator *this,string *error_kind,string *error_struct,string *sub_error_kind,
          string *error_message)

{
  ostream *poVar1;
  string local_c0;
  string local_a0;
  string local_80;
  string local_50;
  string *local_30;
  string *error_message_local;
  string *sub_error_kind_local;
  string *error_struct_local;
  string *error_kind_local;
  t_rs_generator *this_local;
  
  local_30 = error_message;
  error_message_local = sub_error_kind;
  sub_error_kind_local = error_struct;
  error_struct_local = error_kind;
  error_kind_local = (string *)this;
  t_generator::indent_abi_cxx11_(&local_50,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_50);
  poVar1 = std::operator<<(poVar1,"Err(");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  t_generator::indent_up(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_80,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_80);
  poVar1 = std::operator<<(poVar1,"thrift::Error::");
  poVar1 = std::operator<<(poVar1,(string *)error_struct_local);
  poVar1 = std::operator<<(poVar1,"(");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_80);
  t_generator::indent_up(&this->super_t_generator);
  render_thrift_error_struct(this,sub_error_kind_local,error_message_local,local_30);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_a0,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_a0);
  poVar1 = std::operator<<(poVar1,")");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a0);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_c0,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_c0);
  poVar1 = std::operator<<(poVar1,")");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

void t_rs_generator::render_thrift_error(
  const string& error_kind,
  const string& error_struct,
  const string& sub_error_kind,
  const string& error_message
) {
  f_gen_ << indent() << "Err(" << endl;
  indent_up();
  f_gen_ << indent() << "thrift::Error::" << error_kind << "(" << endl;
  indent_up();
  render_thrift_error_struct(error_struct, sub_error_kind, error_message);
  indent_down();
  f_gen_ << indent() << ")" << endl;
  indent_down();
  f_gen_ << indent() << ")" << endl;
}